

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.hpp
# Opt level: O1

basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> * __thiscall
jessilib::string_cast<char16_t,std::__cxx11::string>
          (basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
           *__return_storage_ptr__,jessilib *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_string)

{
  anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
  *paVar1;
  char *extraout_RDX;
  char *pcVar2;
  size_t sVar3;
  char *extraout_RDX_00;
  size_t sVar4;
  jessilib *this_00;
  decode_result dVar5;
  basic_string_view<char,_std::char_traits<char>_> in_string_00;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> result;
  basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = L'\0';
  sVar4 = *(size_t *)this;
  this_00 = *(jessilib **)(this + 8);
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  reserve(&local_50,(size_type)this_00);
  paVar1 = &__return_storage_ptr__->field_2;
  pcVar2 = extraout_RDX;
  do {
    if (this_00 == (jessilib *)0x0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        paVar1->_M_allocated_capacity =
             CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,local_50.field_2._M_local_buf[0])
        ;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_50.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = local_50._M_dataplus._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,local_50.field_2._M_local_buf[0])
        ;
      }
      __return_storage_ptr__->_M_string_length = local_50._M_string_length;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = L'\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
LAB_0020dc56:
      if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                                 local_50.field_2._M_local_buf[0]) * 2 + 2);
      }
      return __return_storage_ptr__;
    }
    in_string_00._M_str = pcVar2;
    in_string_00._M_len = sVar4;
    dVar5 = decode_codepoint_utf8<char>(this_00,in_string_00);
    sVar3 = dVar5.units;
    if (sVar3 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar1;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
      goto LAB_0020dc56;
    }
    encode_codepoint_utf16<char16_t,std::__cxx11::u16string>(&local_50,dVar5.codepoint);
    sVar4 = sVar4 + sVar3;
    this_00 = this_00 + -sVar3;
    pcVar2 = extraout_RDX_00;
  } while( true );
}

Assistant:

std::basic_string<OutCharT> string_cast(const InT& in_string) {
	static_assert(impl_unicode::is_string<InT>::value == true);
	using InCharT = std::remove_cvref_t<typename impl_unicode::is_string<InT>::type>;
	using InEquivalentT = typename unicode_traits<InCharT>::equivalent_type;
	using InViewT = std::basic_string_view<InCharT>;
	using OutT = std::basic_string<OutCharT>;

	if constexpr (std::is_same_v<InT, OutT>) {
		// This does nothing at all; consider static_assert against this?
		return in_string;
	}
	else if constexpr (std::is_same_v<OutCharT, InCharT>
	    || std::is_same_v<OutCharT, InEquivalentT>) {
		// Just do a dumb copy when same or equivalent char types; should be faster than re-encoding
		if constexpr (impl_unicode::is_string<InT>::is_container) {
			return { reinterpret_cast<const OutCharT*>(in_string.data()), in_string.size() };
		}
		else if constexpr (impl_unicode::is_string<InT>::is_fixed_array) {
			return { reinterpret_cast<const OutCharT*>(in_string), std::size(in_string) - 1 }; // strip null term
		}
		else {
			return { reinterpret_cast<const OutCharT*>(in_string) };
		}
	}
	else {
		// Last resort: reencode the string
		std::basic_string<OutCharT> result;
		InViewT in_string_view = static_cast<InViewT>(in_string);
		if constexpr (sizeof(InCharT) <= sizeof(OutCharT)) {
			// When copying to a larger type, we will need _at most_ as many elements as the smaller storage type
			result.reserve(in_string_view.size());
		}
		else {
			result.reserve(in_string_view.size() * (sizeof(OutCharT) / sizeof(InCharT)));
		}

		while (!in_string_view.empty()) {
			decode_result string_front = decode_codepoint(in_string_view);
			if (string_front.units == 0) {
				return {};
			}
			in_string_view.remove_prefix(string_front.units);

			encode_codepoint(result, string_front.codepoint);
		}

		return result;
	}
}